

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O1

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  void *pvVar2;
  undefined1 *puVar3;
  undefined8 uVar4;
  uv_stream_t *unaff_RBX;
  void *pvVar5;
  uv_loop_t *puVar6;
  undefined1 *puVar7;
  undefined1 auStack_120 [248];
  uv_stream_t *puStack_28;
  code *pcStack_20;
  
  if (status == 0) {
    puVar6 = (uv_loop_t *)0xf8;
    pcStack_20 = (code *)0x172940;
    pvVar2 = malloc(0xf8);
    unaff_RBX = server;
    if (pvVar2 == (void *)0x0) goto LAB_00172992;
    puVar6 = server->loop;
    pcStack_20 = (code *)0x172959;
    pvVar5 = pvVar2;
    iVar1 = uv_tcp_init_ex(puVar6,pvVar2,2);
    status = (int)pvVar5;
    if (iVar1 != 0) goto LAB_00172997;
    pcStack_20 = (code *)0x172968;
    pvVar5 = pvVar2;
    puVar6 = (uv_loop_t *)server;
    iVar1 = uv_accept();
    status = (int)pvVar5;
    if (iVar1 == -0x10) {
      pcStack_20 = (code *)0x172977;
      uv_close(server,0);
      uv_close(pvVar2,free);
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x172992;
    on_connection_cold_1();
    puVar6 = (uv_loop_t *)server;
LAB_00172992:
    pcStack_20 = (code *)0x172997;
    on_connection_cold_4();
LAB_00172997:
    pcStack_20 = (code *)0x17299c;
    on_connection_cold_2();
  }
  pcStack_20 = on_connect;
  on_connection_cold_3();
  if (status == 0) {
    uv_close(puVar6->pending_queue[0],0);
    return;
  }
  puStack_28 = (uv_stream_t *)0x1729b6;
  on_connect_cold_1();
  puStack_28 = unaff_RBX;
  puVar3 = (undefined1 *)uv_default_loop();
  puVar7 = puVar3;
  iVar1 = uv_tcp_init(puVar3,auStack_120);
  if (iVar1 == 0) {
    puVar7 = auStack_120;
    iVar1 = uv_tcp_nodelay(puVar7,1);
    if (iVar1 != 0) goto LAB_00172a66;
    puVar7 = auStack_120;
    iVar1 = uv_tcp_keepalive(puVar7,1,0x3c);
    if (iVar1 != 0) goto LAB_00172a6b;
    uv_close(auStack_120,0);
    iVar1 = uv_run(puVar3,0);
    if (iVar1 == 0) {
      uVar4 = uv_default_loop();
      uv_walk(uVar4,close_walk_cb,0);
      uv_run(uVar4,0);
      puVar3 = (undefined1 *)uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00172a75;
    }
  }
  else {
    run_test_tcp_flags_cold_1();
LAB_00172a66:
    run_test_tcp_flags_cold_2();
LAB_00172a6b:
    puVar3 = puVar7;
    run_test_tcp_flags_cold_3();
  }
  run_test_tcp_flags_cold_4();
LAB_00172a75:
  run_test_tcp_flags_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar3,0);
  return;
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  uv_stream_t* stream;
  int r;

  if (status != 0) {
    fprintf(stderr, "Connect error %s\n", uv_err_name(status));
  }
  ASSERT(status == 0);

  switch (serverType) {
  case TCP:
    stream = malloc(sizeof(uv_tcp_t));
    ASSERT(stream != NULL);
    r = uv_tcp_init(loop, (uv_tcp_t*)stream);
    ASSERT(r == 0);
    break;

  case PIPE:
    stream = malloc(sizeof(uv_pipe_t));
    ASSERT(stream != NULL);
    r = uv_pipe_init(loop, (uv_pipe_t*)stream, 0);
    ASSERT(r == 0);
    break;

  default:
    ASSERT(0 && "Bad serverType");
    abort();
  }

  /* associate server with stream */
  stream->data = server;

  r = uv_accept(server, stream);
  ASSERT(r == 0);

  r = uv_read_start(stream, echo_alloc, after_read);
  ASSERT(r == 0);
}